

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

MeshAttributeIndicesEncodingData * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
GetAttributeEncodingData
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          int att_id)

{
  ulong uVar1;
  ulong uVar2;
  pointer pAVar3;
  pointer pAVar4;
  uint32_t i;
  ulong uVar5;
  
  pAVar3 = (this->attribute_data_).
           super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->attribute_data_).
                 super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3) / 0x130;
  uVar1 = 0;
  do {
    uVar5 = uVar1;
    if (uVar2 <= uVar5) goto LAB_001361f6;
    uVar1 = (ulong)((int)uVar5 + 1);
  } while (pAVar3[uVar5].attribute_index != att_id);
  pAVar3 = (pointer)&pAVar3[uVar5].encoding_data;
LAB_001361f6:
  pAVar4 = (pointer)&this->pos_encoding_data_;
  if (uVar5 < uVar2) {
    pAVar4 = pAVar3;
  }
  return (MeshAttributeIndicesEncodingData *)pAVar4;
}

Assistant:

const MeshAttributeIndicesEncodingData *
MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetAttributeEncodingData(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    if (attribute_data_[i].attribute_index == att_id) {
      return &attribute_data_[i].encoding_data;
    }
  }
  return &pos_encoding_data_;
}